

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hud.cpp
# Opt level: O3

void __thiscall CHud::RenderGameTimer(CHud *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ITextRender *pIVar4;
  int iVar5;
  int iVar6;
  int64 iVar7;
  int64 iVar8;
  CGameClient *pCVar9;
  char *pcVar10;
  CNetObj_GameData *pCVar11;
  IClient *pIVar12;
  long in_FS_OFFSET;
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar13;
  char aBuf [32];
  undefined4 local_50;
  char local_48 [40];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar9 = (this->super_CComponent).m_pClient;
  pCVar11 = (pCVar9->m_Snap).m_pGameData;
  uVar1 = pCVar11->m_GameStateFlags;
  pIVar12 = (IClient *)(ulong)uVar1;
  iVar6 = 0;
  if ((uVar1 & 2) == 0) {
    iVar2 = (pCVar9->m_GameInfo).m_TimeLimit;
    if (iVar2 == 0 || (uVar1 & 1) != 0) {
      if ((uVar1 & 0xc) == 0) {
        pIVar12 = pCVar9->m_pClient;
        iVar6 = pIVar12->m_CurGameTick - pCVar11->m_GameStartTick;
      }
      else {
        iVar6 = pCVar11->m_GameStateEndTick;
        pIVar12 = pCVar9->m_pClient;
      }
      pCVar11 = (CNetObj_GameData *)(ulong)(uint)(iVar6 % pIVar12->m_GameTickSpeed);
      iVar6 = iVar6 / pIVar12->m_GameTickSpeed;
    }
    else {
      iVar5 = pCVar9->m_pClient->m_CurGameTick - pCVar11->m_GameStartTick;
      iVar3 = pCVar9->m_pClient->m_GameTickSpeed;
      pCVar11 = (CNetObj_GameData *)((long)iVar5 % (long)iVar3 & 0xffffffff);
      iVar6 = 0;
      if ((uVar1 & 0xc) == 0) {
        iVar6 = iVar2 * 0x3c - iVar5 / iVar3;
      }
    }
  }
  iVar2 = pCVar9->m_pGraphics->m_ScreenWidth;
  iVar3 = pCVar9->m_pGraphics->m_ScreenHeight;
  if ((RenderGameTimer()::s_Cursor == '\0') &&
     (iVar5 = __cxa_guard_acquire(&RenderGameTimer()::s_Cursor,pIVar12,pCVar11), iVar5 != 0)) {
    CTextCursor::CTextCursor(&RenderGameTimer::s_Cursor,10.0,0);
    __cxa_atexit(CTextCursor::~CTextCursor,&RenderGameTimer::s_Cursor,&__dso_handle);
    __cxa_guard_release(&RenderGameTimer()::s_Cursor);
  }
  aVar13.x = ((float)iVar2 / (float)iVar3) * 300.0 * 0.5;
  RenderGameTimer::s_Cursor.m_CursorPos.field_1.y = 2.0;
  RenderGameTimer::s_Cursor.m_Align = 1;
  RenderGameTimer::s_Cursor.m_CursorPos.field_0.x = aVar13.x;
  CTextCursor::Reset(&RenderGameTimer::s_Cursor,(long)iVar6);
  str_format(local_48,0x20,"%d:%02d",(ulong)(uint)(iVar6 / 0x3c),(ulong)(uint)(iVar6 % 0x3c));
  pCVar9 = (this->super_CComponent).m_pClient;
  if ((((pCVar9->m_GameInfo).m_TimeLimit == 0) || (0x3c < iVar6)) ||
     ((((pCVar9->m_Snap).m_pGameData)->m_GameStateFlags & 1) != 0)) {
    local_50 = 0x3f800000;
  }
  else {
    if (iVar6 < 0xb) {
      iVar7 = time_get();
      iVar8 = time_freq();
      local_50 = *(undefined4 *)(&DAT_001d9ae4 + (ulong)(((iVar7 * 2) / iVar8 & 1U) == 0) * 4);
      pCVar9 = (this->super_CComponent).m_pClient;
    }
    else {
      local_50 = 0x3f800000;
    }
    (*(pCVar9->m_pTextRender->super_IInterface)._vptr_IInterface[4])
              (0x3f800000,0x3e800000,0x3e800000,0x3f800000);
    pCVar9 = (this->super_CComponent).m_pClient;
  }
  (*(pCVar9->m_pTextRender->super_IInterface)._vptr_IInterface[7])
            (pCVar9->m_pTextRender,&RenderGameTimer::s_Cursor,local_48,0xffffffff);
  pIVar4 = ((this->super_CComponent).m_pClient)->m_pTextRender;
  (*(pIVar4->super_IInterface)._vptr_IInterface[0x10])
            (local_50,pIVar4,&RenderGameTimer::s_Cursor,0,0xffffffff);
  (*(((this->super_CComponent).m_pClient)->m_pTextRender->super_IInterface)._vptr_IInterface[4])
            (0x3f800000,0x3f800000,0x3f800000,0x3f800000);
  if ((((((this->super_CComponent).m_pClient)->m_Snap).m_pGameData)->m_GameStateFlags & 2) != 0) {
    if ((RenderGameTimer()::s_SuddenDeathCursor == '\0') &&
       (iVar6 = __cxa_guard_acquire(&RenderGameTimer()::s_SuddenDeathCursor), iVar6 != 0)) {
      CTextCursor::CTextCursor(&RenderGameTimer::s_SuddenDeathCursor,12.0,0);
      __cxa_atexit(CTextCursor::~CTextCursor,&RenderGameTimer::s_SuddenDeathCursor,&__dso_handle);
      __cxa_guard_release(&RenderGameTimer()::s_SuddenDeathCursor);
    }
    RenderGameTimer::s_SuddenDeathCursor.m_CursorPos.field_1.y = 14.0;
    RenderGameTimer::s_SuddenDeathCursor.m_Align = 1;
    RenderGameTimer::s_SuddenDeathCursor.m_CursorPos.field_0.x = aVar13.x;
    CTextCursor::Reset(&RenderGameTimer::s_SuddenDeathCursor,(long)g_Localization.m_CurrentVersion);
    pcVar10 = Localize("Sudden Death","");
    pIVar4 = ((this->super_CComponent).m_pClient)->m_pTextRender;
    (*(pIVar4->super_IInterface)._vptr_IInterface[0xb])
              (pIVar4,&RenderGameTimer::s_SuddenDeathCursor,pcVar10,0xffffffff);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CHud::RenderGameTimer()
{
	float x = 300.0f*Graphics()->ScreenAspect()/2.0f;

	int Time = 0;
	if(m_pClient->m_Snap.m_pGameData->m_GameStateFlags&GAMESTATEFLAG_SUDDENDEATH)
		Time = 0;
	else if(m_pClient->m_GameInfo.m_TimeLimit && !(m_pClient->m_Snap.m_pGameData->m_GameStateFlags&GAMESTATEFLAG_WARMUP))
	{
		Time = m_pClient->m_GameInfo.m_TimeLimit*60 - ((Client()->GameTick()-m_pClient->m_Snap.m_pGameData->m_GameStartTick)/Client()->GameTickSpeed());

		if(m_pClient->m_Snap.m_pGameData->m_GameStateFlags&(GAMESTATEFLAG_ROUNDOVER|GAMESTATEFLAG_GAMEOVER))
			Time = 0;
	}
	else if(m_pClient->m_Snap.m_pGameData->m_GameStateFlags&(GAMESTATEFLAG_ROUNDOVER|GAMESTATEFLAG_GAMEOVER))
		Time = m_pClient->m_Snap.m_pGameData->m_GameStateEndTick/Client()->GameTickSpeed();
	else
		Time = (Client()->GameTick()-m_pClient->m_Snap.m_pGameData->m_GameStartTick)/Client()->GameTickSpeed();

	static CTextCursor s_Cursor(10.0f);
	s_Cursor.MoveTo(x, 2.0f);
	s_Cursor.m_Align = TEXTALIGN_TC;
	s_Cursor.Reset(Time);

	char aBuf[32];
	str_format(aBuf, sizeof(aBuf), "%d:%02d", Time/60, Time%60);

	// last 60 sec red, last 10 sec blink
	float Alpha = 1.0f;
	if(m_pClient->m_GameInfo.m_TimeLimit && Time <= 60 && !(m_pClient->m_Snap.m_pGameData->m_GameStateFlags&GAMESTATEFLAG_WARMUP))
	{
		Alpha = Time <= 10 && (2*time_get()/time_freq()) % 2 ? 0.5f : 1.0f;
		TextRender()->TextColor(1.0f, 0.25f, 0.25f, 1.0f);
	}
	TextRender()->TextDeferred(&s_Cursor, aBuf, -1.0f);
	TextRender()->DrawTextOutlined(&s_Cursor, Alpha);
	TextRender()->TextColor(1.0f, 1.0f, 1.0f, 1.0f);

	if(m_pClient->m_Snap.m_pGameData->m_GameStateFlags&GAMESTATEFLAG_SUDDENDEATH)
	{
		static CTextCursor s_SuddenDeathCursor(12.0f);
		s_SuddenDeathCursor.MoveTo(x, 14.0f);
		s_SuddenDeathCursor.m_Align = TEXTALIGN_TC;
		s_SuddenDeathCursor.Reset(g_Localization.Version());
		const char *pText = Localize("Sudden Death");
		TextRender()->TextOutlined(&s_SuddenDeathCursor, pText, -1);
	}
}